

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O1

void WebPSamplerProcessPlane
               (uint8_t *y,int y_stride,uint8_t *u,uint8_t *v,int uv_stride,uint8_t *dst,
               int dst_stride,int width,int height,WebPSamplerRowFunc func)

{
  long lVar1;
  uint uVar2;
  
  if (0 < height) {
    uVar2 = 0;
    do {
      (*func)(y,u,v,dst,width);
      y = y + y_stride;
      lVar1 = (long)uv_stride;
      if ((uVar2 & 1) == 0) {
        lVar1 = 0;
      }
      v = v + lVar1;
      u = u + lVar1;
      dst = dst + dst_stride;
      uVar2 = uVar2 + 1;
    } while (height != uVar2);
  }
  return;
}

Assistant:

void WebPSamplerProcessPlane(const uint8_t* WEBP_RESTRICT y, int y_stride,
                             const uint8_t* WEBP_RESTRICT u,
                             const uint8_t* WEBP_RESTRICT v, int uv_stride,
                             uint8_t* WEBP_RESTRICT dst, int dst_stride,
                             int width, int height, WebPSamplerRowFunc func) {
  int j;
  for (j = 0; j < height; ++j) {
    func(y, u, v, dst, width);
    y += y_stride;
    if (j & 1) {
      u += uv_stride;
      v += uv_stride;
    }
    dst += dst_stride;
  }
}